

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thdat08.c
# Opt level: O3

int th08_open(thdat_t *thdat,thtk_error_t **error)

{
  off_t oVar1;
  off_t oVar2;
  ssize_t sVar3;
  uchar *data;
  thtk_io_t *input;
  thtk_io_t *output;
  char *buf;
  ulong uVar4;
  size_t sVar5;
  thdat_entry_t *ptVar6;
  size_t sVar7;
  thdat_entry_t *ptVar8;
  thdat_entry_t *ptVar9;
  char *__src;
  int iVar10;
  int iVar11;
  uint uVar12;
  int local_40;
  uint local_3c;
  uint uStack_38;
  uint local_34;
  ulong uVar13;
  
  oVar1 = thtk_io_seek(thdat->stream,0,2,error);
  iVar10 = 0;
  if (oVar1 != -1) {
    oVar2 = thtk_io_seek(thdat->stream,0,0,error);
    iVar10 = 0;
    if (oVar2 != -1) {
      sVar3 = thtk_io_read(thdat->stream,&local_40,0x10,error);
      if (sVar3 == -1) {
        iVar10 = 0;
      }
      else if (local_40 == 0x5a474250) {
        th_decrypt((uchar *)&local_3c,0xc,'\x1b','7',0xc,0x400);
        uVar13 = (ulong)_local_3c >> 0x20;
        local_3c = (int)_local_3c - 0x1e240;
        uStack_38 = (int)uVar13 - 0x5464e;
        local_34 = local_34 - 0x8aa53;
        iVar11 = 0;
        oVar2 = thtk_io_seek(thdat->stream,(ulong)uStack_38,0,error);
        iVar10 = 0;
        if (oVar2 != -1) {
          uVar12 = (int)oVar1 - uStack_38;
          uVar13 = (ulong)uVar12;
          data = (uchar *)malloc(uVar13);
          sVar3 = thtk_io_read(thdat->stream,data,uVar13,error);
          if (sVar3 != -1) {
            th_decrypt(data,uVar12,'>',0x9b,0x80,0x400);
            input = thtk_io_open_memory(data,uVar13,error);
            iVar10 = iVar11;
            if (input != (thtk_io_t *)0x0) {
              output = thtk_io_open_growing_memory(error);
              if (output != (thtk_io_t *)0x0) {
                sVar3 = th_unlzss(input,output,(ulong)local_34,error);
                if (sVar3 != -1) {
                  thtk_io_close(input);
                  buf = (char *)malloc((ulong)local_34);
                  oVar2 = thtk_io_seek(output,0,0,error);
                  iVar10 = 0;
                  if (oVar2 != -1) {
                    uVar4 = thtk_io_read(output,buf,(ulong)local_34,error);
                    iVar10 = 0;
                    if (uVar4 == local_34) {
                      thtk_io_close(output);
                      if (local_3c != 0) {
                        uVar12 = 0;
                        __src = buf;
                        do {
                          sVar5 = thdat->entry_count + 1;
                          thdat->entry_count = sVar5;
                          ptVar6 = (thdat_entry_t *)realloc(thdat->entries,sVar5 * 0x120);
                          thdat->entries = ptVar6;
                          sVar5 = thdat->entry_count;
                          ptVar9 = ptVar6 + (sVar5 - 1);
                          thdat_entry_init(ptVar9);
                          strcpy(ptVar9->name,__src);
                          sVar7 = strlen(ptVar9->name);
                          ptVar6[sVar5 - 1].offset = (ulong)*(uint *)(__src + sVar7 + 1);
                          ptVar6[sVar5 - 1].size = (ulong)*(uint *)(__src + sVar7 + 5);
                          ptVar6[sVar5 - 1].extra = *(uint32_t *)(__src + sVar7 + 9);
                          uVar12 = uVar12 + 1;
                          uVar4 = (ulong)local_3c;
                          __src = __src + sVar7 + 0xd;
                        } while (uVar12 < local_3c);
                        if (uVar4 != 0) {
                          ptVar6 = thdat->entries;
                          ptVar9 = (thdat_entry_t *)0x0;
                          do {
                            ptVar8 = ptVar6;
                            if (ptVar9 != (thdat_entry_t *)0x0) {
                              ptVar9->zsize = ptVar8->offset - ptVar9->offset;
                            }
                            uVar4 = uVar4 - 1;
                            ptVar6 = ptVar8 + 1;
                            ptVar9 = ptVar8;
                          } while (uVar4 != 0);
                          ptVar8->zsize = oVar1 - (uVar13 + ptVar8->offset);
                        }
                      }
                      free(buf);
                      iVar10 = 1;
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        thtk_error_func_new(error,"th08_open","magic not PBGZ");
        iVar10 = 0;
      }
    }
  }
  return iVar10;
}

Assistant:

static int
th08_open(
    thdat_t* thdat,
    thtk_error_t** error)
{
    unsigned char* data;
    unsigned char* zdata;
    off_t filesize = thtk_io_seek(thdat->stream, 0, SEEK_END, error);
    if (filesize == -1)
        return 0;
    if (thtk_io_seek(thdat->stream, 0, SEEK_SET, error) == -1)
        return 0;

    th08_archive_header_t header;

    if (thtk_io_read(thdat->stream, &header, sizeof(header), error) == -1)
        return 0;

    if (strncmp(header.magic, "PBGZ", 4)) {
        thtk_error_new(error, "magic not PBGZ");
        return 0;
    }

    th_decrypt((unsigned char*)&header + 4, sizeof(header) - 4, 0x1b, 0x37, sizeof(header) - 4, 0x400);

    header.count -= 123456;
    header.offset -= 345678;
    header.size -= 567891;

    if (thtk_io_seek(thdat->stream, header.offset, SEEK_SET, error) == -1)
        return 0;

    unsigned int zsize = filesize - header.offset;
    zdata = malloc(zsize);

    if (thtk_io_read(thdat->stream, zdata, zsize, error) == -1)
        return 0;

    th_decrypt(zdata, zsize, 0x3e, 0x9b, 0x80, 0x400);

    thtk_io_t* compressed_data = thtk_io_open_memory(zdata, zsize, error);
    if (!compressed_data)
        return 0;
    thtk_io_t* raw_data = thtk_io_open_growing_memory(error);
    if (!raw_data)
        return 0;
    if (th_unlzss(compressed_data, raw_data, header.size, error) == -1)
        return 0;

    thtk_io_close(compressed_data);

    data = malloc(header.size);
    if (thtk_io_seek(raw_data, 0, SEEK_SET, error) == -1)
        return 0;
    if (thtk_io_read(raw_data, data, header.size, error) != header.size)
        return 0;
    thtk_io_close(raw_data);

    const uint32_t* ptr = (uint32_t*)data;
    for (unsigned int i = 0; i < header.count; ++i) {
        thdat_entry_t* entry;
        ARRAY_GROW(thdat->entry_count, thdat->entries, entry);
        thdat_entry_init(entry);

        strcpy(entry->name, (char*)ptr);
        ptr = (uint32_t*)((char*)ptr + strlen(entry->name) + 1);
        entry->offset = *ptr++;
        entry->size = *ptr++;
        entry->extra = *ptr++;
    }

    if (header.count) {
        thdat_entry_t* prev = NULL;
        for (unsigned int i = 0; i < header.count; ++i) {
            thdat_entry_t* entry = &thdat->entries[i];
            if (prev)
                prev->zsize = entry->offset - prev->offset;
            prev = entry;
        }
        prev->zsize = (filesize - zsize) - prev->offset;
    }

    free(data);

    return 1;
}